

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::compute_rhoRT(PeleLM *this,MultiFab *S,MultiFab *Press,int pComp)

{
  bool bVar1;
  Print *pPVar2;
  Print *x;
  Print *in_RSI;
  FabArrayBase *in_RDI;
  Real run_time;
  int IOProc;
  Array4<double> *P;
  Array4<const_double> *T;
  Array4<const_double> *rhoY;
  Array4<const_double> *rho;
  Box *bx;
  MFIter mfi;
  Real strt_time;
  char (*in_stack_fffffffffffffb48) [37];
  Print *in_stack_fffffffffffffb50;
  MFIter *in_stack_fffffffffffffb58;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb70;
  undefined1 do_tiling_;
  anon_class_256_4_b94cda3b *in_stack_fffffffffffffb98;
  Box *in_stack_fffffffffffffba0;
  MFIter *in_stack_fffffffffffffbb0;
  Print *in_stack_fffffffffffffbc0;
  double local_2e0;
  int local_2d4;
  undefined1 local_2d0 [64];
  undefined1 auStack_290 [64];
  undefined1 auStack_250 [64];
  undefined1 auStack_210 [64];
  undefined1 local_1d0 [64];
  undefined1 *local_190;
  undefined1 local_188 [64];
  undefined1 *local_148;
  undefined1 local_140 [64];
  undefined1 *local_100;
  undefined1 local_f8 [64];
  undefined1 *local_b8;
  undefined1 local_ac [28];
  undefined1 *local_90;
  MFIter local_88;
  double local_28;
  Print *local_10;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffb70 >> 0x38);
  local_10 = in_RSI;
  local_28 = amrex::ParallelDescriptor::second();
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter((MFIter *)local_10,in_RDI,(bool)do_tiling_);
  pPVar2 = local_10;
  while( true ) {
    bVar1 = amrex::MFIter::isValid(&local_88);
    if (!bVar1) break;
    amrex::MFIter::tilebox(in_stack_fffffffffffffbb0);
    local_90 = local_ac;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    local_b8 = local_f8;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    local_100 = local_140;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    local_148 = local_188;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    local_190 = local_1d0;
    memcpy(local_2d0,local_b8,0x3c);
    memcpy(auStack_290,local_100,0x3c);
    memcpy(auStack_250,local_148,0x3c);
    memcpy(auStack_210,local_190,0x3c);
    amrex::ParallelFor<PeleLM::compute_rhoRT(amrex::MultiFab_const&,amrex::MultiFab&,int)::__0>
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    amrex::MFIter::operator++(&local_88);
  }
  amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffb50);
  if (2 < NavierStokesBase::verbose) {
    local_2d4 = amrex::ParallelDescriptor::IOProcessorNumber();
    local_2e0 = amrex::ParallelDescriptor::second();
    local_2e0 = local_2e0 - local_28;
    amrex::ParallelDescriptor::ReduceRealMax<double>(&local_2e0,local_2d4);
    amrex::OutStream();
    amrex::Print::Print(pPVar2,(ostream *)in_RDI);
    amrex::Print::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    amrex::Print::operator<<(in_stack_fffffffffffffb50,(int *)in_stack_fffffffffffffb48);
    pPVar2 = amrex::Print::operator<<
                       (in_stack_fffffffffffffb50,(char (*) [9])in_stack_fffffffffffffb48);
    x = amrex::Print::operator<<(pPVar2,(double *)in_stack_fffffffffffffb48);
    amrex::Print::operator<<(pPVar2,(char *)x);
    amrex::Print::~Print(in_stack_fffffffffffffbc0);
  }
  return;
}

Assistant:

void
PeleLM::compute_rhoRT (const MultiFab& S,
                             MultiFab& Press,
                             int       pComp)
{
   AMREX_ASSERT(pComp<Press.nComp());

   const Real strt_time = ParallelDescriptor::second();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   {
      for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.tilebox();
         auto const& rho     = S.const_array(mfi,Density);
         auto const& rhoY    = S.const_array(mfi,first_spec);
         auto const& T       = S.const_array(mfi,Temp);
         auto const& P       = Press.array(mfi, pComp);
         amrex::ParallelFor(bx, [rho, rhoY, T, P]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            getPGivenRTY( i, j, k, rho, rhoY, T, P );
         });
      }
   }

   if (verbose > 2)
   {
     const int IOProc   = ParallelDescriptor::IOProcessorNumber();
     Real      run_time = ParallelDescriptor::second() - strt_time;

     ParallelDescriptor::ReduceRealMax(run_time,IOProc);

     amrex::Print() << "      PeleLM::compute_rhoRT(): lev: " << level
                    << ", time: " << run_time << '\n';
   }
}